

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::MacOSXUseInstallNameDir(cmGeneratorTarget *this)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  char *val;
  string *target;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"BUILD_WITH_INSTALL_NAME_DIR",&local_39);
  val = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (val == (char *)0x0) {
    PVar2 = GetPolicyStatusCMP0068(this);
    if (PVar2 == NEW) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"BUILD_WITH_INSTALL_RPATH",&local_39);
      bVar1 = GetPropertyAsBool(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1 && PVar2 == WARN) {
        this_00 = this->LocalGenerator->GlobalGenerator;
        target = GetName_abi_cxx11_(this);
        cmGlobalGenerator::AddCMP0068WarnTarget(this_00,target);
        bVar1 = true;
      }
    }
  }
  else {
    bVar1 = cmSystemTools::IsOn(val);
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::MacOSXUseInstallNameDir() const
{
  const char* build_with_install_name =
    this->GetProperty("BUILD_WITH_INSTALL_NAME_DIR");
  if (build_with_install_name) {
    return cmSystemTools::IsOn(build_with_install_name);
  }

  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();
  if (cmp0068 == cmPolicies::NEW) {
    return false;
  }

  bool use_install_name = this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH");

  if (use_install_name && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return use_install_name;
}